

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int secp256k1_sign_and_abs64(uint64_t *out,int64_t in)

{
  ulong uVar1;
  int ret;
  uint64_t mask1;
  uint64_t mask0;
  int64_t in_local;
  uint64_t *out_local;
  
  uVar1 = (long)(int)(uint)(in < 0) - 1;
  *out = in;
  *out = *out & uVar1 | (*out ^ 0xffffffffffffffff) + 1 & (uVar1 ^ 0xffffffffffffffff);
  return (uint)(in < 0);
}

Assistant:

SECP256K1_INLINE static int secp256k1_sign_and_abs64(uint64_t *out, int64_t in) {
    uint64_t mask0, mask1;
    int ret;
    ret = in < 0;
    mask0 = ret + ~((uint64_t)0);
    mask1 = ~mask0;
    *out = (uint64_t)in;
    *out = (*out & mask0) | ((~*out + 1) & mask1);
    return ret;
}